

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O1

void writeHash2<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,SeedType *seed,size_t n1,size_t n2,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *layer1,string *hash_str,string map_name,string *default_value,
               bool nonKeyLookups)

{
  ushort uVar1;
  uint16_t seed_00;
  pointer pBVar2;
  pointer pbVar3;
  pointer pcVar4;
  size_type sVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  size_type *psVar14;
  uint uVar15;
  pointer pBVar16;
  char cVar17;
  string *psVar18;
  long lVar19;
  uint uVar20;
  size_type sVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  string upper_name;
  string __str_1;
  uint local_108;
  string __str;
  vector<int,_std::allocator<int>_> mapping;
  string local_a8;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pBVar16 = (layer1->
            super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (layer1->
           super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar16 != pBVar2) {
    uVar10 = (long)pBVar2 - (long)pBVar16 >> 5;
    lVar12 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<writeHash2<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
              (pBVar16,pBVar2,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<writeHash2<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
              (pBVar16,pBVar2);
  }
  upper_name._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&mapping,n2 + 1,(value_type_conflict4 *)&upper_name,(allocator_type *)&__str_1);
  pbVar3 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 5;
    uVar1 = *seed;
    lVar19 = 0;
    do {
      pcVar4 = pbVar3[lVar19]._M_dataplus._M_p;
      sVar5 = pbVar3[lVar19]._M_string_length;
      uVar20 = 0;
      if (sVar5 != 0) {
        sVar21 = 0;
        uVar20 = 0;
        do {
          uVar20 = uVar20 * uVar1 + (int)pcVar4[sVar21];
          sVar21 = sVar21 + 1;
        } while (sVar5 != sVar21);
      }
      if (sVar5 == 0) {
        uVar15 = 0;
      }
      else {
        local_108 = (uint)n1;
        sVar21 = 0;
        uVar15 = 0;
        do {
          uVar15 = (int)pcVar4[sVar21] +
                   uVar15 * (layer1->
                            super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar20 & local_108].seed;
          sVar21 = sVar21 + 1;
        } while (sVar5 != sVar21);
      }
      mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar15 & (uint)n2] = (int)lVar19;
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar12 + (ulong)(lVar12 == 0));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,vals);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,*(long *)map_name._M_dataplus._M_p,
             *(long *)(map_name._M_dataplus._M_p + 8) + *(long *)map_name._M_dataplus._M_p);
  getCommonCodeGen<std::__cxx11::string>
            (&upper_name,keys,&local_48,&mapping,n2,&local_a8,(bool)map_name.field_2._M_local_buf[0]
            );
  std::__cxx11::string::operator=((string *)hash_str,(string *)&upper_name);
  paVar22 = &upper_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)upper_name._M_dataplus._M_p != paVar22) {
    operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  uVar10 = n1 + 1;
  cVar17 = '\x01';
  if (9 < uVar10) {
    uVar13 = uVar10;
    cVar8 = '\x04';
    do {
      cVar17 = cVar8;
      if (uVar13 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_0010fbf8;
      }
      if (uVar13 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_0010fbf8;
      }
      if (uVar13 < 10000) goto LAB_0010fbf8;
      bVar6 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar8 = cVar17 + '\x04';
    } while (bVar6);
    cVar17 = cVar17 + '\x01';
  }
LAB_0010fbf8:
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar10);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x1172ee);
  psVar14 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar14) {
    __str_1.field_2._M_allocated_capacity = *psVar14;
    __str_1.field_2._8_8_ = plVar11[3];
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
  }
  else {
    __str_1.field_2._M_allocated_capacity = *psVar14;
    __str_1._M_dataplus._M_p = (pointer)*plVar11;
  }
  __str_1._M_string_length = plVar11[1];
  *plVar11 = (long)psVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&__str_1);
  psVar14 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar14) {
    upper_name.field_2._M_allocated_capacity = *psVar14;
    upper_name.field_2._8_8_ = plVar11[3];
    upper_name._M_dataplus._M_p = (pointer)paVar22;
  }
  else {
    upper_name.field_2._M_allocated_capacity = *psVar14;
    upper_name._M_dataplus._M_p = (pointer)*plVar11;
  }
  upper_name._M_string_length = plVar11[1];
  *plVar11 = (long)psVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::_M_append((char *)hash_str,(ulong)upper_name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)upper_name._M_dataplus._M_p != paVar22) {
    operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  pBVar16 = (layer1->
            super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (layer1->
           super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar16 != pBVar2) {
    uVar10 = 0;
    lVar12 = 0;
    do {
      if ((lVar12 != 0) && (-lVar12 == (uVar10 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)hash_str);
      }
      uVar1 = pBVar16->seed;
      uVar20 = 1;
      if (((9 < uVar1) && (uVar20 = 2, 99 < uVar1)) && (uVar20 = 3, 999 < uVar1)) {
        uVar20 = 5 - (uVar1 < 10000);
      }
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_1,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str_1._M_dataplus._M_p,uVar20,(uint)uVar1);
      plVar11 = (long *)std::__cxx11::string::append((char *)&__str_1);
      psVar14 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar14) {
        upper_name.field_2._M_allocated_capacity = *psVar14;
        upper_name.field_2._8_8_ = plVar11[3];
        upper_name._M_dataplus._M_p = (pointer)&upper_name.field_2;
      }
      else {
        upper_name.field_2._M_allocated_capacity = *psVar14;
        upper_name._M_dataplus._M_p = (pointer)*plVar11;
      }
      upper_name._M_string_length = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)hash_str,(ulong)upper_name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)upper_name._M_dataplus._M_p != &upper_name.field_2) {
        operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      pBVar16 = pBVar16 + 1;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + -1;
    } while (pBVar16 != pBVar2);
  }
  paVar22 = &upper_name.field_2;
  std::__cxx11::string::append((char *)hash_str);
  seed_00 = *seed;
  psVar18 = *(string **)map_name._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,psVar18,
             (long)&(psVar18->_M_dataplus)._M_p + *(long *)(map_name._M_dataplus._M_p + 8));
  local_88.field_2._M_allocated_capacity._0_7_ = 0x74733a3a647473;
  local_88.field_2._7_4_ = 0x676e6972;
  local_88._M_string_length = 0xb;
  local_88.field_2._M_local_buf[0xb] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  hashStr2(&upper_name,psVar18,seed_00,n1,n2,(string *)map_name._M_string_length,&local_68,&local_88
           ,(bool)map_name.field_2._M_local_buf[0]);
  std::__cxx11::string::_M_append((char *)hash_str,(ulong)upper_name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)upper_name._M_dataplus._M_p != paVar22) {
    operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT17(local_88.field_2._M_local_buf[7],
                             local_88.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  upper_name._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&upper_name,*(long *)map_name._M_dataplus._M_p,
             *(long *)(map_name._M_dataplus._M_p + 8) + *(long *)map_name._M_dataplus._M_p);
  sVar5 = upper_name._M_string_length;
  _Var7._M_p = upper_name._M_dataplus._M_p;
  if (upper_name._M_string_length != 0) {
    sVar21 = 0;
    do {
      iVar9 = toupper((int)_Var7._M_p[sVar21]);
      _Var7._M_p[sVar21] = (char)iVar9;
      sVar21 = sVar21 + 1;
    } while (sVar5 != sVar21);
  }
  std::operator+(&__str,"#endif // POIFECT_",&upper_name);
  plVar11 = (long *)std::__cxx11::string::append((char *)&__str);
  psVar14 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar14) {
    __str_1.field_2._M_allocated_capacity = *psVar14;
    __str_1.field_2._8_8_ = plVar11[3];
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
  }
  else {
    __str_1.field_2._M_allocated_capacity = *psVar14;
    __str_1._M_dataplus._M_p = (pointer)*plVar11;
  }
  __str_1._M_string_length = plVar11[1];
  *plVar11 = (long)psVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::_M_append((char *)hash_str,(ulong)__str_1._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)upper_name._M_dataplus._M_p != paVar22) {
    operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
  }
  if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void writeHash2(const std::vector<KeyType>& keys,
               const SeedType& seed,
               size_t n1,
               size_t n2,
               const std::vector<std::string>& vals,
               std::vector<Bin<KeyType>> layer1,
               std::string& hash_str,
               std::string map_name,
               const std::string& default_value,
               bool nonKeyLookups){

    struct LayerSort{
        inline bool operator() (const Bin<KeyType>& a, const Bin<KeyType>& b){
            return (a.generating_hash < b.generating_hash);
        }
    };
    std::sort(layer1.begin(), layer1.end(), LayerSort());

    std::vector<int> mapping(n2+1, -1);
    for(size_t i = 0; i < keys.size(); i++){
        const KeyType& key = keys[i];
        uint32_t h = hash2(key, seed) & n1;
        uint32_t s1 = layer1[h].seed;
        size_t final = hash2(key, s1) & n2;
        mapping[final] = i;
    }

    hash_str = getCommonCodeGen(keys, vals, mapping, n2, map_name, nonKeyLookups);

    hash_str += "    static constexpr std::array<uint16_t, " + std::to_string(n1+1) + "> seeds {\n        ";

    size_t i = 0;
    for(const auto& bin : layer1){
        if(i && i%entries_per_row==0) hash_str += "\n        ";
        i++;
        hash_str += std::to_string(bin.seed) + ",";
    }
    hash_str += "\n    };\n\n";

    hash_str += hashStr2(keys[0], seed, n1, n2, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";
}